

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.h
# Opt level: O2

void __thiscall absl::BadStatusOrAccess::~BadStatusOrAccess(BadStatusOrAccess *this)

{
  *(undefined ***)this = &PTR__BadStatusOrAccess_0018fe20;
  std::__cxx11::string::_M_dispose();
  Status::~Status(&this->status_);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

~BadStatusOrAccess() override = default;